

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyusdz.cc
# Opt level: O2

bool tinyusdz::ReadUSDZAssetInfoFromFile
               (string *_filename,USDZAsset *asset,string *warn,string *err,
               size_t max_memory_limit_in_mb)

{
  bool bVar1;
  bool bVar2;
  string *warn_00;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  string base_dir;
  string filepath;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_88;
  string local_70;
  string local_50;
  
  bVar2 = false;
  io::ExpandFilePath(&local_50,(string *)_filename,(void *)0x0);
  io::GetBaseDir(&local_70,(string *)_filename);
  local_88._M_impl.super__Vector_impl_data._M_start = (uint8_t *)0x0;
  local_88._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  warn_00 = (string *)0x0;
  bVar1 = io::ReadWholeFile((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_88,
                            (string *)err,&local_50,max_memory_limit_in_mb << 0x14,(void *)0x0);
  if (bVar1) {
    bVar2 = ReadUSDZAssetInfoFromMemory
                      (local_88._M_impl.super__Vector_impl_data._M_start,
                       (long)local_88._M_impl.super__Vector_impl_data._M_finish -
                       (long)local_88._M_impl.super__Vector_impl_data._M_start,false,asset,warn_00,
                       err);
  }
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_88);
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::_M_dispose();
  return bVar2;
}

Assistant:

bool ReadUSDZAssetInfoFromFile(const std::string &_filename, USDZAsset *asset,
  std::string *warn, std::string *err, size_t max_memory_limit_in_mb) {

  std::string filepath = io::ExpandFilePath(_filename, /* userdata */ nullptr);
  std::string base_dir = io::GetBaseDir(_filename);

  std::vector<uint8_t> data;
  size_t max_bytes = 1024ull * 1024ull * max_memory_limit_in_mb;
  if (!io::ReadWholeFile(&data, err, filepath, max_bytes,
                         /* userdata */ nullptr)) {
    return false;
  }

  return ReadUSDZAssetInfoFromMemory(data.data(), data.size(), /* asset_on_memory */false, asset, warn, err);

}